

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

size_t __thiscall
google::protobuf::compiler::CodeGeneratorRequest::ByteSizeLong(CodeGeneratorRequest *this)

{
  uint uVar1;
  Rep *pRVar2;
  Type *value;
  size_t sVar3;
  size_t sVar4;
  int index;
  ulong uVar5;
  void **ppvVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  uVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  uVar8 = (ulong)uVar1;
  uVar5 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar5 = uVar8;
    index = 0;
  }
  for (; (int)uVar5 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(this->file_to_generate_).super_RepeatedPtrFieldBase,index);
    sVar3 = internal::WireFormatLite::StringSize(value);
    uVar8 = uVar8 + sVar3;
  }
  lVar9 = (long)(this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  sVar3 = uVar8 + lVar9;
  pRVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.rep_;
  ppvVar6 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar6 = (void **)0x0;
  }
  for (lVar7 = 0; lVar9 * 8 != lVar7; lVar7 = lVar7 + 8) {
    sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::FileDescriptorProto>
                      (*(FileDescriptorProto **)((long)ppvVar6 + lVar7));
    sVar3 = sVar3 + sVar4;
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar4 = internal::WireFormatLite::StringSize
                        ((string *)((ulong)(this->parameter_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                        );
      sVar3 = sVar3 + sVar4 + 1;
    }
    if ((uVar1 & 2) != 0) {
      sVar4 = internal::WireFormatLite::MessageSize<google::protobuf::compiler::Version>
                        (this->compiler_version_);
      sVar3 = sVar3 + sVar4 + 1;
    }
  }
  sVar3 = Message::MaybeComputeUnknownFieldsSize(&this->super_Message,sVar3,&this->_cached_size_);
  return sVar3;
}

Assistant:

size_t CodeGeneratorRequest::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.CodeGeneratorRequest)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(file_to_generate_.size());
  for (int i = 0, n = file_to_generate_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      file_to_generate_.Get(i));
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  total_size += 1UL * this->_internal_proto_file_size();
  for (const auto& msg : this->proto_file_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    // optional string parameter = 2;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_parameter());
    }

    // optional .google.protobuf.compiler.Version compiler_version = 3;
    if (cached_has_bits & 0x00000002u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *compiler_version_);
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}